

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::quickCoreQueries_abi_cxx11_(CommonCore *this,string_view queryStr)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  CommonCore *in_RSI;
  string *in_RDI;
  CommonCore *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  string *psVar2;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  allocator<char> local_149 [17];
  undefined8 local_138;
  undefined8 local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_121 [2];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b0;
  undefined8 local_a8;
  allocator<char> local_89 [17];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_18;
  undefined8 local_10;
  
  psVar2 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe20,
             (char *)in_stack_fffffffffffffe18);
  __x._M_str = (char *)in_RSI;
  __x._M_len = (size_t)psVar2;
  __y._M_str = (char *)in_RDI;
  __y._M_len = in_stack_fffffffffffffe28;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    local_50 = local_18;
    local_48 = local_10;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe20,
               (char *)in_stack_fffffffffffffe18);
    __x_00._M_str = (char *)in_RSI;
    __x_00._M_len = (size_t)psVar2;
    __y_00._M_str = (char *)in_RDI;
    __y_00._M_len = in_stack_fffffffffffffe28;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      local_78 = local_18;
      local_70 = local_10;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe20,
                 (char *)in_stack_fffffffffffffe18);
      __x_01._M_str = (char *)in_RSI;
      __x_01._M_len = (size_t)psVar2;
      __y_01._M_str = (char *)in_RDI;
      __y_01._M_len = in_stack_fffffffffffffe28;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        isConnected(in_stack_fffffffffffffe10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(allocator<char> *)in_RSI);
        std::allocator<char>::~allocator(local_89);
        return psVar2;
      }
      local_b0 = local_18;
      local_a8 = local_10;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe20,
                 (char *)in_stack_fffffffffffffe18);
      __x_02._M_str = (char *)in_RSI;
      __x_02._M_len = (size_t)psVar2;
      __y_02._M_str = (char *)in_RDI;
      __y_02._M_len = in_stack_fffffffffffffe28;
      bVar1 = std::operator==(__x_02,__y_02);
      if (!bVar1) {
        local_d0 = local_18;
        local_c8 = local_10;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe20,
                   (char *)in_stack_fffffffffffffe18);
        __x_03._M_str = (char *)in_RSI;
        __x_03._M_len = (size_t)psVar2;
        __y_03._M_str = (char *)in_RDI;
        __y_03._M_len = in_stack_fffffffffffffe28;
        bVar1 = std::operator==(__x_03,__y_03);
        if (!bVar1) {
          local_138 = local_18;
          local_130 = local_10;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe20,
                     (char *)in_stack_fffffffffffffe18);
          __x_04._M_str = (char *)in_RSI;
          __x_04._M_len = (size_t)psVar2;
          __y_04._M_str = (char *)in_RDI;
          __y_04._M_len = in_stack_fffffffffffffe28;
          bVar1 = std::operator==(__x_04,__y_04);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(allocator<char> *)in_RSI
                      );
            std::allocator<char>::~allocator(local_149);
            return psVar2;
          }
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe20,
                     (char *)in_stack_fffffffffffffe18);
          __x_05._M_str = (char *)in_RSI;
          __x_05._M_len = (size_t)psVar2;
          __y_05._M_str = (char *)in_RDI;
          __y_05._M_len = in_stack_fffffffffffffe28;
          bVar1 = std::operator==(__x_05,__y_05);
          if (!bVar1) {
            std::__cxx11::string::string(in_stack_fffffffffffffe20);
            return psVar2;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(allocator<char> *)in_RSI);
          std::operator+(in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
          std::operator+(in_stack_fffffffffffffe18,(char)((ulong)in_stack_fffffffffffffe10 >> 0x38))
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe10);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe10);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe4f);
          return psVar2;
        }
      }
      __lhs = local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(allocator<char> *)in_RSI);
      getIdentifier_abi_cxx11_(in_RSI);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffe10);
      std::operator+(__lhs,(char)((ulong)in_stack_fffffffffffffe10 >> 0x38));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10);
      std::allocator<char>::~allocator((allocator<char> *)local_121);
      return psVar2;
    }
  }
  generateStringVector<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,helics::CommonCore::quickCoreQueries(std::basic_string_view<char,std::char_traits<char>>)const::__0>
            (in_RDI,querySet_abi_cxx11_);
  return psVar2;
}

Assistant:

std::string CommonCore::quickCoreQueries(std::string_view queryStr) const
{
    if ((queryStr == "queries") || (queryStr == "available_queries")) {
        return generateStringVector(querySet, [](const std::string& data) { return data; });
    }
    if (queryStr == "isconnected") {
        return (isConnected()) ? "true" : "false";
    }
    if (queryStr == "name" || queryStr == "identifier") {
        return std::string{"\""} + getIdentifier() + '"';
    }
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return std::string{"\""} + versionString + '"';
    }
    return std::string{};
}